

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

Dic<asl::String> * __thiscall
asl::Map<asl::String,_asl::Dic<asl::String>_>::operator[]
          (Map<asl::String,_asl::Dic<asl::String>_> *this,String *key)

{
  int iVar1;
  Dic<asl::String> *local_38;
  Dic<asl::String> *p;
  String *key_local;
  Map<asl::String,_asl::Dic<asl::String>_> *this_local;
  
  local_38 = find(this,key);
  if ((Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::def == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Map<asl::String,asl::Dic<asl::String>>::
                                   operator[](asl::String_const&)::def), iVar1 != 0)) {
    Dic<asl::String>::Dic(&operator[]::def);
    __cxa_atexit(Dic<asl::String>::~Dic,&operator[]::def,&__dso_handle);
    __cxa_guard_release(&Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::def
                       );
  }
  if (local_38 == (Dic<asl::String> *)0x0) {
    local_38 = &operator[]::def;
  }
  return local_38;
}

Assistant:

const T& operator[](const K& key) const
	{
		const T* p = find(key);
		static T def = T();
		return p ? *p : def;
	}